

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O1

adios2_engine * adios2_open_with_metadata(adios2_io *io,char *name,char *md,size_t mdsize)

{
  adios2_engine *paVar1;
  allocator local_69;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"for adios2_io, in call to adios2_open_with_metadata","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)local_68,name,&local_69);
  paVar1 = (adios2_engine *)adios2::core::IO::Open((string *)io,(char *)local_68,(ulong)md);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return paVar1;
}

Assistant:

adios2_engine *adios2_open_with_metadata(adios2_io *io, const char *name, const char *md,
                                         const size_t mdsize)
{
    adios2_engine *engine = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_open_with_metadata");
        engine = reinterpret_cast<adios2_engine *>(
            &reinterpret_cast<adios2::core::IO *>(io)->Open(name, md, mdsize));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_open_with_metadata");
    }
    return engine;
}